

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O0

char * google::GetAnsiColorCode(GLogColor color)

{
  char *pcStack_10;
  GLogColor color_local;
  
  switch(color) {
  case COLOR_DEFAULT:
    pcStack_10 = "";
    break;
  case COLOR_RED:
    pcStack_10 = "1";
    break;
  case COLOR_GREEN:
    pcStack_10 = "2";
    break;
  case COLOR_YELLOW:
    pcStack_10 = "3";
    break;
  default:
    pcStack_10 = (char *)0x0;
  }
  return pcStack_10;
}

Assistant:

static const char* GetAnsiColorCode(GLogColor color) {
  switch (color) {
  case COLOR_RED:     return "1";
  case COLOR_GREEN:   return "2";
  case COLOR_YELLOW:  return "3";
  case COLOR_DEFAULT:  return "";
  };
  return NULL; // stop warning about return type.
}